

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void unlink_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req == &unlink_req) {
    if (unlink_req.fs_type == UV_FS_UNLINK) {
      if (unlink_req.result == 0) {
        unlink_cb_count = unlink_cb_count + 1;
        uv_fs_req_cleanup(&unlink_req);
        return;
      }
      pcVar2 = "req->result == 0";
      uVar1 = 0x149;
    }
    else {
      pcVar2 = "req->fs_type == UV_FS_UNLINK";
      uVar1 = 0x148;
    }
  }
  else {
    pcVar2 = "req == &unlink_req";
    uVar1 = 0x147;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void unlink_cb(uv_fs_t* req) {
  ASSERT(req == &unlink_req);
  ASSERT(req->fs_type == UV_FS_UNLINK);
  ASSERT(req->result == 0);
  unlink_cb_count++;
  uv_fs_req_cleanup(req);
}